

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# computation.c
# Opt level: O0

void apx_computation_create
               (apx_computation_t *self,apx_computation_vtable_t *vtable,
               apx_computationType_t computation_type)

{
  apx_computationType_t computation_type_local;
  apx_computation_vtable_t *vtable_local;
  apx_computation_t *self_local;
  
  if (self != (apx_computation_t *)0x0) {
    if (vtable == (apx_computation_vtable_t *)0x0) {
      memset(self,0,0x10);
    }
    else {
      (self->vtable).destructor = vtable->destructor;
      (self->vtable).to_string = vtable->to_string;
    }
    self->computation_type = computation_type;
    self->is_signed_range = false;
    (self->lower_limit).u32 = 0;
    (self->upper_limit).u32 = 0;
  }
  return;
}

Assistant:

void apx_computation_create(apx_computation_t* self, apx_computation_vtable_t const* vtable, apx_computationType_t computation_type)
{
   if (self != NULL)
   {
      if (vtable != NULL)
      {
         memcpy(&self->vtable, vtable, sizeof(apx_computation_vtable_t));
      }
      else
      {
         memset(&self->vtable, 0u, sizeof(apx_computation_vtable_t));
      }
      self->computation_type = computation_type;
      self->is_signed_range = false;
      self->lower_limit.i32 = 0;
      self->upper_limit.i32 = 0;
   }
}